

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_image_ccitt.c
# Opt level: O3

HPDF_STATUS
HPDF_Stream_CcittToStream
          (HPDF_BYTE *buf,HPDF_Stream dst,HPDF_Encrypt e,HPDF_UINT width,HPDF_UINT height,
          HPDF_UINT line_width,HPDF_BOOL top_is_first)

{
  uchar *bp;
  tidata_t ptVar1;
  uint bs;
  uint uVar2;
  int iVar3;
  int32 iVar4;
  int32 iVar5;
  HPDF_Fax3CodecState *pHVar6;
  uint32 *puVar7;
  uchar *puVar8;
  HPDF_UINT HVar9;
  tableentry *tab;
  uint uVar10;
  ulong uVar11;
  HPDF_Fax3CodecState *esp;
  uint32 rowbytes;
  uint uVar12;
  HPDF_STATUS HVar13;
  uint32 rowpixels;
  uint bs_00;
  int bs_01;
  uchar *local_80;
  _HPDF_CCITT_Data local_70;
  long local_48;
  uchar *local_40;
  HPDF_Fax3CodecState *local_38;
  
  HVar13 = 1;
  if (height != 0) {
    if (top_is_first == 0) {
      local_80 = buf + (height - 1) * line_width;
      uVar11 = -(ulong)line_width;
      HVar9 = -line_width;
    }
    else {
      uVar11 = (ulong)(height * line_width);
      local_80 = buf;
      HVar9 = line_width;
    }
    local_70.dst = dst;
    local_70.tif_rawcp = (tidata_t)malloc(0x4000);
    local_70.tif_rawdatasize = 0x4000;
    local_70.tif_rawcc = 0;
    local_70.tif_rawdata = local_70.tif_rawcp;
    pHVar6 = (HPDF_Fax3CodecState *)malloc(0x80);
    if (pHVar6 != (HPDF_Fax3CodecState *)0x0) {
      (pHVar6->b).faxdcs = (char *)0x0;
      pHVar6->refline = (uchar *)0x0;
      (pHVar6->b).groupoptions = 0;
      (pHVar6->b).recvparams = 0;
      (pHVar6->b).subaddress = (char *)0x0;
      (pHVar6->b).rowbytes = line_width;
      (pHVar6->b).rowpixels = width;
      uVar12 = width * 2 + 0x3e & 0xffffffc0;
      local_70.tif_data = pHVar6;
      puVar7 = (uint32 *)malloc((ulong)(uVar12 * 2 + 6) << 2);
      pHVar6->runs = puVar7;
      if (puVar7 == (uint32 *)0x0) {
        HVar13 = 1;
      }
      else {
        pHVar6->curruns = puVar7;
        pHVar6->refruns = puVar7 + (uVar12 | 3);
        HVar13 = 1;
        puVar8 = (uchar *)calloc(1,(ulong)line_width);
        pHVar6->refline = puVar8;
        if (puVar8 != (uchar *)0x0) {
          local_40 = buf + uVar11;
          pHVar6->data = 0;
          pHVar6->bit = 8;
          pHVar6->k = 0;
          pHVar6->maxk = 0;
          pHVar6->line = 0;
          if (local_40 != local_80) {
            local_48 = (long)(int)HVar9;
            do {
              if (0 < (int)line_width) {
                local_38 = local_70.tif_data;
                pHVar6 = local_70.tif_data;
                puVar8 = local_80;
                HVar9 = line_width;
                do {
                  bp = pHVar6->refline;
                  uVar12 = (pHVar6->b).rowpixels;
                  uVar11 = 0;
                  bs = 0;
                  if (-1 < (char)*puVar8) {
                    bs = find0span(puVar8,0,uVar12);
                  }
                  if (-1 < (char)*bp) {
                    uVar2 = find0span(bp,0,uVar12);
                    uVar11 = (ulong)uVar2;
                  }
                  uVar2 = 0;
                  while( true ) {
                    bs_00 = (uint)uVar11;
                    uVar10 = uVar12;
                    if (bs_00 < uVar12) {
                      if ((bp[uVar11 >> 3] >> (~(byte)uVar11 & 7) & 1) == 0) {
                        iVar3 = find0span(bp,bs_00,uVar12);
                      }
                      else {
                        iVar3 = find1span(bp,bs_00,uVar12);
                      }
                      uVar10 = iVar3 + bs_00;
                    }
                    if (uVar10 < bs) {
                      HPDF_Fax3PutBits(&local_70,1,4);
                      uVar2 = uVar10;
                    }
                    else {
                      uVar10 = (bs_00 - bs) + 3;
                      if (uVar10 < 7) {
                        HPDF_Fax3PutBits(&local_70,(uint)vcodes[uVar10].code,
                                         (uint)vcodes[uVar10].length);
                        uVar2 = bs;
                      }
                      else {
                        uVar10 = uVar12;
                        if (bs < uVar12) {
                          if ((puVar8[bs >> 3] >> (~(byte)bs & 7) & 1) == 0) {
                            iVar3 = find0span(puVar8,bs,uVar12);
                          }
                          else {
                            iVar3 = find1span(puVar8,bs,uVar12);
                          }
                          uVar10 = iVar3 + bs;
                        }
                        HPDF_Fax3PutBits(&local_70,1,3);
                        if ((uVar2 + bs == 0) ||
                           ((puVar8[uVar2 >> 3] >> (~(byte)uVar2 & 7) & 1) == 0)) {
                          putspan(&local_70,bs - uVar2,HPDF_TIFFFaxWhiteCodes);
                          tab = HPDF_TIFFFaxBlackCodes;
                        }
                        else {
                          putspan(&local_70,bs - uVar2,HPDF_TIFFFaxBlackCodes);
                          tab = HPDF_TIFFFaxWhiteCodes;
                        }
                        putspan(&local_70,uVar10 - bs,tab);
                        uVar2 = uVar10;
                      }
                    }
                    pHVar6 = local_38;
                    if (uVar12 <= uVar2) break;
                    if ((puVar8[uVar2 >> 3] >> (~(byte)uVar2 & 7) & 1) == 0) {
                      iVar4 = find0span(puVar8,uVar2,uVar12);
                      iVar5 = find1span(bp,uVar2,uVar12);
                      bs_01 = iVar5 + uVar2;
                      iVar3 = find0span(bp,bs_01,uVar12);
                    }
                    else {
                      iVar4 = find1span(puVar8,uVar2,uVar12);
                      iVar5 = find0span(bp,uVar2,uVar12);
                      bs_01 = iVar5 + uVar2;
                      iVar3 = find1span(bp,bs_01,uVar12);
                    }
                    uVar11 = (ulong)(uint)(bs_01 + iVar3);
                    bs = iVar4 + uVar2;
                  }
                  memcpy(local_38->refline,puVar8,(ulong)(local_38->b).rowbytes);
                  uVar12 = (pHVar6->b).rowbytes;
                  puVar8 = puVar8 + uVar12;
                  HVar9 = HVar9 - uVar12;
                } while (0 < (int)HVar9);
              }
              local_80 = local_80 + local_48;
            } while (local_40 != local_80);
          }
          HPDF_Fax3PutBits(&local_70,1,0xc);
          HPDF_Fax3PutBits(&local_70,1,0xc);
          ptVar1 = local_70.tif_rawdata;
          if ((0 < local_70.tif_rawcc) &&
             (HVar13 = HPDF_Stream_Write(local_70.dst,local_70.tif_rawdata,local_70.tif_rawcc),
             HVar13 == 0)) {
            local_70._16_8_ = local_70._16_8_ & 0xffffffff;
            local_70.tif_rawcp = ptVar1;
          }
          HVar13 = 0;
        }
      }
      HPDF_FreeCCITTFax3(&local_70);
    }
  }
  return HVar13;
}

Assistant:

HPDF_STATUS 
HPDF_Stream_CcittToStream( const HPDF_BYTE   *buf,
                            HPDF_Stream  dst,
							HPDF_Encrypt  e,
							HPDF_UINT          width,
							HPDF_UINT          height,
							HPDF_UINT          line_width,
							HPDF_BOOL		   top_is_first)
{
	const HPDF_BYTE   *pBufPos;
	const HPDF_BYTE   *pBufEnd; /* end marker */
	int lineIncrement;
	struct _HPDF_CCITT_Data data;

	HPDF_UNUSED (e);

	if(height==0) return 1;
	if(top_is_first) {
		pBufPos = buf;
		pBufEnd=buf+(line_width*height);
		lineIncrement = line_width;
	} else {
		pBufPos = buf+(line_width*(height-1));
		pBufEnd= buf-line_width;
		lineIncrement = -((int)line_width);
	}	

	memset(&data, 0, sizeof(struct _HPDF_CCITT_Data));
	data.dst = dst;
	data.tif_rawdata = (tidata_t) malloc( 16384 ); /*  16 kb buffer */
	data.tif_rawdatasize = 16384;
	data.tif_rawcc = 0;
	data.tif_rawcp = data.tif_rawdata;

	if(HPDF_InitCCITTFax3(&data)!=HPDF_OK)
		return 1;

	if(HPDF_Fax3SetupState(&data, width, height, line_width)!=HPDF_OK)
	{
		HPDF_FreeCCITTFax3(&data);
		return 1;
	}

	if(HPDF_Fax3PreEncode(&data)!=HPDF_OK)
	{
		HPDF_FreeCCITTFax3(&data);
		return 1;
	}

	/*  encode data */
	while(pBufEnd!=pBufPos)
	{
		HPDF_Fax4Encode(&data, (tidata_t)pBufPos, line_width);
		pBufPos+=lineIncrement;
	}

	HPDF_Fax4PostEncode(&data);

	HPDF_FreeCCITTFax3(&data);

	return HPDF_OK;
}